

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basictests.cpp
# Opt level: O2

void test32<67910u>(void)

{
  ostream *poVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"(32-bit) testing ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  uVar3 = 1;
  while( true ) {
    uVar2 = (uint)uVar3;
    if (uVar2 == 0) {
      return;
    }
    uVar4 = uVar3 * 0xf70cfd89 & 0xffffffffffff;
    iVar5 = (int)(uVar3 / 0x10946) * -0x10946 + uVar2;
    uVar6 = (uint)(uVar3 / 0x10946);
    uVar7 = (uint)(uVar3 / 0x10946);
    if ((((iVar5 == 0) != uVar4 < 0xf70cfd89) || (uVar6 != uVar7)) ||
       (iVar5 != (uint)(ushort)(uVar3 / 0x10946) * -0x10946 + uVar2)) break;
    uVar3 = (ulong)(uVar2 + 1);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"problem with n = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"quotient: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar7);
  poVar1 = std::operator<<(poVar1," expected: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar6);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"remainder: ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(uint)(ushort)(uVar3 / 0x10946) * -0x10946 + uVar2);
  poVar1 = std::operator<<(poVar1," expected: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)(uVar3 / 0x10946) * -0x10946 + uVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"multiple: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar4 < 0xf70cfd89);
  poVar1 = std::operator<<(poVar1," expected: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5 == 0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"need_fallback = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,false);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"is_power_2    = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,false);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"c             = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xf70cfd89);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"leading_zeroes= ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xf);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"log2_divisor  = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x10);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"m             = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1000000000000);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"overflow      = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,true);
  std::endl<char,std::char_traits<char>>(poVar1);
  abort();
}

Assistant:

void test32() {
  std::cout << "(32-bit) testing " << divisor << std::endl;
  for (uint32_t n = 1; n != 0; n++) {
    bool quotient_ok =
        fast_division::divide32<divisor>::quotient(n) == n / divisor;
    bool remainder_ok =
        fast_division::divide32<divisor>::remainder(n) == n % divisor;
    bool mult_ok =
        fast_division::divide32<divisor>::is_divisible(n) == (n % divisor == 0);
    if (!quotient_ok || !remainder_ok || !mult_ok) {
      std::cerr << "problem with n = " << n << std::endl;
      std::cout << "quotient: " << fast_division::divide32<divisor>::quotient(n)
                << " expected: " << n / divisor << std::endl;
      std::cout << "remainder: "
                << fast_division::divide32<divisor>::remainder(n)
                << " expected: " << n % divisor << std::endl;
      std::cout << "multiple: "
                << fast_division::divide32<divisor>::is_divisible(n)
                << " expected: " << (n % divisor == 0) << std::endl;

      std::cout << "need_fallback = "
                << fast_division::divide32<divisor>::need_fallback << std::endl;
      std::cout << "is_power_2    = "
                << fast_division::divide32<divisor>::is_power_2 << std::endl;
      std::cout << "c             = " << fast_division::divide32<divisor>::c
                << std::endl;
      std::cout << "leading_zeroes= "
                << fast_division::divide32<divisor>::leading_zeroes
                << std::endl;
      std::cout << "log2_divisor  = "
                << fast_division::divide32<divisor>::log2_divisor << std::endl;
      std::cout << "m             = " << fast_division::divide32<divisor>::m
                << std::endl;
      std::cout << "overflow      = "
                << fast_division::divide32<divisor>::overflow << std::endl;

      abort();
    }
  }
}